

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 *puVar16;
  __m128i *in_RCX;
  __m128i *in_RDX;
  int in_ESI;
  __m128i *in_RDI;
  __m128i *in_R8;
  uint8_t *in_R9;
  ushort uVar17;
  ushort uVar18;
  ulong uVar19;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar20 [16];
  ulong uVar29;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar36 [16];
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i q [2];
  __m128i p_1 [2];
  __m128i qs [2];
  __m128i ps [2];
  __m128i ffff;
  __m128i one;
  __m128i four;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i abs_q2q1;
  __m128i abs_q1q0;
  __m128i abs_p2p1;
  __m128i abs_p1p0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i work;
  __m128i flat;
  __m128i mask;
  __m128i t80;
  __m128i thresh0;
  __m128i limit0;
  __m128i blimit0;
  __m128i zero;
  undefined1 local_f58 [16];
  undefined1 local_f48 [16];
  longlong local_f38;
  longlong lStack_f30;
  undefined1 local_f28 [16];
  undefined1 local_f18 [16];
  undefined1 local_f08 [24];
  undefined4 in_stack_fffffffffffff128;
  __m128i *in_stack_fffffffffffff138;
  ulong local_d98;
  ulong uStack_d90;
  ulong local_d88;
  ulong uStack_d80;
  ulong local_d78;
  ulong uStack_d70;
  uint local_d68;
  uint uStack_d64;
  uint uStack_d60;
  uint uStack_d5c;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  longlong local_c58 [2];
  longlong local_c48 [2];
  longlong local_c38;
  longlong lStack_c30;
  longlong local_c28;
  longlong lStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  int local_bfc;
  undefined1 (*local_bc8) [16];
  undefined1 (*local_bc0) [16];
  undefined1 (*local_bb8) [16];
  undefined1 (*local_bb0) [16];
  undefined1 (*local_ba8) [16];
  undefined1 (*local_ba0) [16];
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined1 local_ae8 [16];
  ulong local_ad8;
  ulong uStack_ad0;
  short local_aa8;
  short sStack_aa6;
  short sStack_aa4;
  short sStack_aa2;
  short sStack_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined2 local_a0c;
  undefined2 local_a0a;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9a8;
  short sStack_9a6;
  short sStack_9a4;
  short sStack_9a2;
  short sStack_9a0;
  short sStack_99e;
  short sStack_99c;
  short sStack_99a;
  short local_998;
  short sStack_996;
  short sStack_994;
  short sStack_992;
  short sStack_990;
  short sStack_98e;
  short sStack_98c;
  short sStack_98a;
  short local_968;
  short sStack_966;
  short sStack_964;
  short sStack_962;
  short sStack_960;
  short sStack_95e;
  short sStack_95c;
  short sStack_95a;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  short sStack_930;
  short sStack_92e;
  short sStack_92c;
  short sStack_92a;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short sStack_8d0;
  short sStack_8ce;
  short sStack_8cc;
  short sStack_8ca;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8c0;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_808;
  short sStack_806;
  short sStack_804;
  short sStack_802;
  short sStack_800;
  short sStack_7fe;
  short sStack_7fc;
  short sStack_7fa;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  undefined4 local_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  uint local_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  int in_stack_fffffffffffffa30;
  __m128i *in_stack_fffffffffffffa38;
  ulong uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong local_588;
  ulong uStack_580;
  ulong local_578;
  ulong uStack_570;
  ulong local_548;
  ulong uStack_540;
  ulong local_538;
  ulong uStack_530;
  ulong local_508;
  ulong uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_448;
  ulong uStack_440;
  ulong local_438;
  ulong uStack_430;
  ulong local_408;
  ulong uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * -2);
  local_f08._0_8_ = *puVar16;
  local_f08._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * -2);
  local_f18._0_8_ = *puVar16;
  local_f18._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  local_f28._0_8_ = *puVar16;
  local_f28._8_8_ = puVar16[1];
  local_f38 = (*in_RDI)[0];
  lStack_f30 = (*in_RDI)[1];
  puVar16 = (undefined8 *)((long)*in_RDI + (long)in_ESI * 2);
  local_f48._0_8_ = *puVar16;
  local_f48._8_8_ = puVar16[1];
  puVar16 = (undefined8 *)((long)*in_RDI + (long)(in_ESI * 2) * 2);
  local_f58._0_8_ = *puVar16;
  local_f58._8_8_ = puVar16[1];
  local_ba0 = (undefined1 (*) [16])local_f08;
  local_ba8 = &local_f18;
  local_bb0 = &local_f28;
  local_bb8 = (undefined1 (*) [16])&local_f38;
  local_bc0 = &local_f48;
  local_bc8 = &local_f58;
  local_bfc = in_stack_00000018;
  local_b98 = 0;
  uStack_b90 = 0;
  local_c18 = 0;
  uStack_c10 = 0;
  local_a0a = 4;
  local_a0c = 1;
  local_a38 = 0x1000100010001;
  uStack_a30 = 0x1000100010001;
  local_a28 = local_a38;
  uStack_a20 = uStack_a30;
  get_limit_dual((uint8_t *)in_RDX,(uint8_t *)in_RCX,(uint8_t *)in_R8,in_R9,in_stack_00000008,
                 in_stack_00000010,in_stack_00000018,(__m128i *)&local_c28,(__m128i *)&local_c38,
                 &local_c48,&local_c58);
  auVar36 = psubusw(*local_ba0,*local_ba8);
  auVar20 = psubusw(*local_ba8,*local_ba0);
  local_3f8 = auVar36._0_8_;
  uStack_3f0 = auVar36._8_8_;
  local_408 = auVar20._0_8_;
  uStack_400 = auVar20._8_8_;
  local_3f8 = local_3f8 | local_408;
  uStack_3f0 = uStack_3f0 | uStack_400;
  auVar36 = psubusw(*local_ba8,*local_bb0);
  auVar20 = psubusw(*local_bb0,*local_ba8);
  local_438 = auVar36._0_8_;
  uStack_430 = auVar36._8_8_;
  local_448 = auVar20._0_8_;
  uStack_440 = auVar20._8_8_;
  local_438 = local_438 | local_448;
  uStack_430 = uStack_430 | uStack_440;
  auVar36 = psubusw(*local_bc0,*local_bb8);
  auVar20 = psubusw(*local_bb8,*local_bc0);
  local_478 = auVar36._0_8_;
  uStack_470 = auVar36._8_8_;
  local_488 = auVar20._0_8_;
  uStack_480 = auVar20._8_8_;
  local_478 = local_478 | local_488;
  uStack_470 = uStack_470 | uStack_480;
  auVar36 = psubusw(*local_bc8,*local_bc0);
  auVar20 = psubusw(*local_bc0,*local_bc8);
  local_4b8 = auVar36._0_8_;
  uStack_4b0 = auVar36._8_8_;
  local_4c8 = auVar20._0_8_;
  uStack_4c0 = auVar20._8_8_;
  local_4b8 = local_4b8 | local_4c8;
  uStack_4b0 = uStack_4b0 | uStack_4c0;
  auVar36 = psubusw(*local_bb0,*local_bb8);
  auVar20 = psubusw(*local_bb8,*local_bb0);
  local_4f8 = auVar36._0_8_;
  uStack_4f0 = auVar36._8_8_;
  local_508 = auVar20._0_8_;
  uStack_500 = auVar20._8_8_;
  auVar36 = psubusw(*local_ba8,*local_bc0);
  auVar20 = psubusw(*local_bc0,*local_ba8);
  local_538 = auVar36._0_8_;
  uStack_530 = auVar36._8_8_;
  local_548 = auVar20._0_8_;
  uStack_540 = auVar20._8_8_;
  local_538 = local_538 | local_548;
  uStack_530 = uStack_530 | uStack_540;
  auVar9._8_8_ = uStack_4f0 | uStack_500;
  auVar9._0_8_ = local_4f8 | local_508;
  auVar8._8_8_ = uStack_4f0 | uStack_500;
  auVar8._0_8_ = local_4f8 | local_508;
  auVar20 = paddusw(auVar9,auVar8);
  local_71c = 1;
  local_718._0_2_ = (ushort)local_538;
  local_718._2_2_ = (ushort)(local_538 >> 0x10);
  local_718._4_2_ = (ushort)(local_538 >> 0x20);
  uStack_710._0_2_ = (ushort)uStack_530;
  uStack_710._2_2_ = (ushort)(uStack_530 >> 0x10);
  uStack_710._4_2_ = (ushort)(uStack_530 >> 0x20);
  local_c98 = CONCAT26((ushort)(local_538 >> 0x31),
                       CONCAT24(local_718._4_2_ >> 1,
                                CONCAT22(local_718._2_2_ >> 1,(ushort)local_718 >> 1)));
  uStack_c90 = CONCAT26((ushort)(uStack_530 >> 0x31),
                        CONCAT24(uStack_710._4_2_ >> 1,
                                 CONCAT22(uStack_710._2_2_ >> 1,(ushort)uStack_710 >> 1)));
  auVar7._8_8_ = uStack_c90;
  auVar7._0_8_ = local_c98;
  auVar20 = paddusw(auVar20,auVar7);
  auVar13._8_8_ = lStack_c20;
  auVar13._0_8_ = local_c28;
  auVar20 = psubusw(auVar20,auVar13);
  local_c68 = auVar20._0_8_;
  uStack_c60 = auVar20._8_8_;
  local_a48 = local_c68;
  uVar14 = local_a48;
  uStack_a40 = uStack_c60;
  uVar15 = uStack_a40;
  local_a58 = local_c18;
  uVar3 = local_a58;
  uStack_a50 = uStack_c10;
  uVar4 = uStack_a50;
  local_a48._0_2_ = auVar20._0_2_;
  local_a48._2_2_ = auVar20._2_2_;
  local_a48._4_2_ = auVar20._4_2_;
  local_a48._6_2_ = auVar20._6_2_;
  uStack_a40._0_2_ = auVar20._8_2_;
  uStack_a40._2_2_ = auVar20._10_2_;
  uStack_a40._4_2_ = auVar20._12_2_;
  uStack_a40._6_2_ = auVar20._14_2_;
  local_a58._0_2_ = (short)local_c18;
  local_a58._2_2_ = (short)((ulong)local_c18 >> 0x10);
  local_a58._4_2_ = (short)((ulong)local_c18 >> 0x20);
  local_a58._6_2_ = (short)((ulong)local_c18 >> 0x30);
  uStack_a50._0_2_ = (short)uStack_c10;
  uStack_a50._2_2_ = (short)((ulong)uStack_c10 >> 0x10);
  uStack_a50._4_2_ = (short)((ulong)uStack_c10 >> 0x20);
  uStack_a50._6_2_ = (short)((ulong)uStack_c10 >> 0x30);
  local_ad8 = CONCAT26(-(ushort)(local_a48._6_2_ == local_a58._6_2_),
                       CONCAT24(-(ushort)(local_a48._4_2_ == local_a58._4_2_),
                                CONCAT22(-(ushort)(local_a48._2_2_ == local_a58._2_2_),
                                         -(ushort)((short)local_a48 == (short)local_a58)))) ^
              0xffffffffffffffff;
  uStack_ad0 = CONCAT26(-(ushort)(uStack_a40._6_2_ == uStack_a50._6_2_),
                        CONCAT24(-(ushort)(uStack_a40._4_2_ == uStack_a50._4_2_),
                                 CONCAT22(-(ushort)(uStack_a40._2_2_ == uStack_a50._2_2_),
                                          -(ushort)((short)uStack_a40 == (short)uStack_a50)))) ^
               0xffffffffffffffff;
  auVar6._8_8_ = lStack_c30;
  auVar6._0_8_ = local_c38;
  auVar5._8_8_ = 0x1000100010001;
  auVar5._0_8_ = 0x1000100010001;
  local_ae8 = paddusw(auVar6,auVar5);
  uVar19 = local_ad8 & local_ae8._0_8_;
  uVar29 = uStack_ad0 & local_ae8._8_8_;
  local_58 = (short)local_4b8;
  sStack_56 = (short)(local_4b8 >> 0x10);
  sStack_54 = (short)(local_4b8 >> 0x20);
  sStack_52 = (short)(local_4b8 >> 0x30);
  sStack_50 = (short)uStack_4b0;
  sStack_4e = (short)(uStack_4b0 >> 0x10);
  sStack_4c = (short)(uStack_4b0 >> 0x20);
  sStack_4a = (short)(uStack_4b0 >> 0x30);
  local_68 = (short)uVar19;
  sStack_66 = (short)(uVar19 >> 0x10);
  sStack_64 = (short)(uVar19 >> 0x20);
  sStack_62 = (short)(uVar19 >> 0x30);
  sStack_60 = (short)uVar29;
  sStack_5e = (short)(uVar29 >> 0x10);
  sStack_5c = (short)(uVar29 >> 0x20);
  sStack_5a = (short)(uVar29 >> 0x30);
  uVar17 = (ushort)(local_58 < local_68) * local_68 | (ushort)(local_58 >= local_68) * local_58;
  uVar21 = (ushort)(sStack_56 < sStack_66) * sStack_66 |
           (ushort)(sStack_56 >= sStack_66) * sStack_56;
  uVar23 = (ushort)(sStack_54 < sStack_64) * sStack_64 |
           (ushort)(sStack_54 >= sStack_64) * sStack_54;
  uVar25 = (ushort)(sStack_52 < sStack_62) * sStack_62 |
           (ushort)(sStack_52 >= sStack_62) * sStack_52;
  uVar27 = (ushort)(sStack_50 < sStack_60) * sStack_60 |
           (ushort)(sStack_50 >= sStack_60) * sStack_50;
  uVar30 = (ushort)(sStack_4e < sStack_5e) * sStack_5e |
           (ushort)(sStack_4e >= sStack_5e) * sStack_4e;
  uVar32 = (ushort)(sStack_4c < sStack_5c) * sStack_5c |
           (ushort)(sStack_4c >= sStack_5c) * sStack_4c;
  uVar34 = (ushort)(sStack_4a < sStack_5a) * sStack_5a |
           (ushort)(sStack_4a >= sStack_5a) * sStack_4a;
  local_78 = (short)local_438;
  sStack_76 = (short)(local_438 >> 0x10);
  sStack_74 = (short)(local_438 >> 0x20);
  sStack_72 = (short)(local_438 >> 0x30);
  sStack_70 = (short)uStack_430;
  sStack_6e = (short)(uStack_430 >> 0x10);
  sStack_6c = (short)(uStack_430 >> 0x20);
  sStack_6a = (short)(uStack_430 >> 0x30);
  local_88 = (short)local_478;
  sStack_86 = (short)(local_478 >> 0x10);
  sStack_84 = (short)(local_478 >> 0x20);
  sStack_82 = (short)(local_478 >> 0x30);
  sStack_80 = (short)uStack_470;
  sStack_7e = (short)(uStack_470 >> 0x10);
  sStack_7c = (short)(uStack_470 >> 0x20);
  sStack_7a = (short)(uStack_470 >> 0x30);
  uVar18 = (ushort)(local_78 < local_88) * local_88 | (ushort)(local_78 >= local_88) * local_78;
  uVar22 = (ushort)(sStack_76 < sStack_86) * sStack_86 |
           (ushort)(sStack_76 >= sStack_86) * sStack_76;
  uVar24 = (ushort)(sStack_74 < sStack_84) * sStack_84 |
           (ushort)(sStack_74 >= sStack_84) * sStack_74;
  uVar26 = (ushort)(sStack_72 < sStack_82) * sStack_82 |
           (ushort)(sStack_72 >= sStack_82) * sStack_72;
  uVar28 = (ushort)(sStack_70 < sStack_80) * sStack_80 |
           (ushort)(sStack_70 >= sStack_80) * sStack_70;
  uVar31 = (ushort)(sStack_6e < sStack_7e) * sStack_7e |
           (ushort)(sStack_6e >= sStack_7e) * sStack_6e;
  uVar33 = (ushort)(sStack_6c < sStack_7c) * sStack_7c |
           (ushort)(sStack_6c >= sStack_7c) * sStack_6c;
  uVar35 = (ushort)(sStack_6a < sStack_7a) * sStack_7a |
           (ushort)(sStack_6a >= sStack_7a) * sStack_6a;
  uVar17 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar21 | ((short)uVar22 >= (short)uVar21) * uVar22;
  uVar23 = ((short)uVar24 < (short)uVar23) * uVar23 | ((short)uVar24 >= (short)uVar23) * uVar24;
  uVar25 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar27 | ((short)uVar28 >= (short)uVar27) * uVar28;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar30 | ((short)uVar31 >= (short)uVar30) * uVar31;
  uVar32 = ((short)uVar33 < (short)uVar32) * uVar32 | ((short)uVar33 >= (short)uVar32) * uVar33;
  uVar34 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  local_c8 = (short)local_3f8;
  sStack_c6 = (short)(local_3f8 >> 0x10);
  sStack_c4 = (short)(local_3f8 >> 0x20);
  sStack_c2 = (short)(local_3f8 >> 0x30);
  sStack_c0 = (short)uStack_3f0;
  sStack_be = (short)(uStack_3f0 >> 0x10);
  sStack_bc = (short)(uStack_3f0 >> 0x20);
  sStack_ba = (short)(uStack_3f0 >> 0x30);
  local_c68._0_4_ =
       CONCAT22((ushort)((short)uVar21 < sStack_c6) * sStack_c6 |
                ((short)uVar21 >= sStack_c6) * uVar21,
                (ushort)((short)uVar17 < local_c8) * local_c8 | ((short)uVar17 >= local_c8) * uVar17
               );
  local_c68._0_6_ =
       CONCAT24((ushort)((short)uVar23 < sStack_c4) * sStack_c4 |
                ((short)uVar23 >= sStack_c4) * uVar23,(undefined4)local_c68);
  local_c68 = CONCAT26((ushort)((short)uVar25 < sStack_c2) * sStack_c2 |
                       ((short)uVar25 >= sStack_c2) * uVar25,(undefined6)local_c68);
  uStack_c60._0_2_ =
       (ushort)((short)uVar27 < sStack_c0) * sStack_c0 | ((short)uVar27 >= sStack_c0) * uVar27;
  uStack_c60._2_2_ =
       (ushort)((short)uVar30 < sStack_be) * sStack_be | ((short)uVar30 >= sStack_be) * uVar30;
  uStack_c60._4_2_ =
       (ushort)((short)uVar32 < sStack_bc) * sStack_bc | ((short)uVar32 >= sStack_bc) * uVar32;
  uStack_c60._6_2_ =
       (ushort)((short)uVar34 < sStack_ba) * sStack_ba | ((short)uVar34 >= sStack_ba) * uVar34;
  auVar12._8_8_ = uStack_c60;
  auVar12._0_8_ = local_c68;
  auVar11._8_8_ = lStack_c30;
  auVar11._0_8_ = local_c38;
  auVar20 = psubusw(auVar12,auVar11);
  local_c68 = auVar20._0_8_;
  uStack_c60 = auVar20._8_8_;
  local_a68 = local_c68;
  uVar1 = local_a68;
  uStack_a60 = uStack_c60;
  uVar2 = uStack_a60;
  local_a78 = local_c18;
  uStack_a70 = uStack_c10;
  local_a68._0_2_ = auVar20._0_2_;
  local_a68._2_2_ = auVar20._2_2_;
  local_a68._4_2_ = auVar20._4_2_;
  local_a68._6_2_ = auVar20._6_2_;
  uStack_a60._0_2_ = auVar20._8_2_;
  uStack_a60._2_2_ = auVar20._10_2_;
  uStack_a60._4_2_ = auVar20._12_2_;
  uStack_a60._6_2_ = auVar20._14_2_;
  local_c68._0_4_ =
       CONCAT22(-(ushort)(local_a68._2_2_ == local_a58._2_2_),
                -(ushort)((short)local_a68 == (short)local_a58));
  local_c68._0_6_ = CONCAT24(-(ushort)(local_a68._4_2_ == local_a58._4_2_),(undefined4)local_c68);
  local_c68 = CONCAT26(-(ushort)(local_a68._6_2_ == local_a58._6_2_),(undefined6)local_c68);
  uStack_c60._0_2_ = -(ushort)((short)uStack_a60 == (short)uStack_a50);
  uStack_c60._2_2_ = -(ushort)(uStack_a60._2_2_ == uStack_a50._2_2_);
  uStack_c60._4_2_ = -(ushort)(uStack_a60._4_2_ == uStack_a50._4_2_);
  uStack_c60._6_2_ = -(ushort)(uStack_a60._6_2_ == uStack_a50._6_2_);
  local_a68 = uVar1;
  uStack_a60 = uVar2;
  local_a58 = uVar3;
  uStack_a50 = uVar4;
  local_a48 = uVar14;
  uStack_a40 = uVar15;
  local_718 = local_538;
  uStack_710 = uStack_530;
  highbd_filter4_dual_sse2
            (in_stack_fffffffffffff138,in_RDI,(__m128i *)CONCAT44(in_ESI,in_stack_fffffffffffff128),
             in_RDX,in_RCX,in_R8,in_stack_fffffffffffffa30,in_stack_fffffffffffffa38);
  auVar36 = psubusw(*local_bc8,*local_bb8);
  auVar20 = psubusw(*local_bb8,*local_bc8);
  local_578 = auVar36._0_8_;
  uStack_570 = auVar36._8_8_;
  local_588 = auVar20._0_8_;
  uStack_580 = auVar20._8_8_;
  local_578 = local_578 | local_588;
  uStack_570 = uStack_570 | uStack_580;
  auVar36 = psubusw(*local_ba0,*local_bb0);
  auVar20 = psubusw(*local_bb0,*local_ba0);
  local_5b8 = auVar36._0_8_;
  uStack_5b0 = auVar36._8_8_;
  uStack_5c0 = auVar20._8_8_;
  local_5b8 = local_5b8 | auVar20._0_8_;
  uStack_5b0 = uStack_5b0 | uStack_5c0;
  local_d8 = (short)local_578;
  sStack_d6 = (short)(local_578 >> 0x10);
  sStack_d4 = (short)(local_578 >> 0x20);
  sStack_d2 = (short)(local_578 >> 0x30);
  sStack_d0 = (short)uStack_570;
  sStack_ce = (short)(uStack_570 >> 0x10);
  sStack_cc = (short)(uStack_570 >> 0x20);
  sStack_ca = (short)(uStack_570 >> 0x30);
  local_e8 = (short)local_5b8;
  sStack_e6 = (short)(local_5b8 >> 0x10);
  sStack_e4 = (short)(local_5b8 >> 0x20);
  sStack_e2 = (short)(local_5b8 >> 0x30);
  sStack_e0 = (short)uStack_5b0;
  sStack_de = (short)(uStack_5b0 >> 0x10);
  sStack_dc = (short)(uStack_5b0 >> 0x20);
  sStack_da = (short)(uStack_5b0 >> 0x30);
  uVar17 = (ushort)(local_d8 < local_e8) * local_e8 | (ushort)(local_d8 >= local_e8) * local_d8;
  uVar21 = (ushort)(sStack_d6 < sStack_e6) * sStack_e6 |
           (ushort)(sStack_d6 >= sStack_e6) * sStack_d6;
  uVar23 = (ushort)(sStack_d4 < sStack_e4) * sStack_e4 |
           (ushort)(sStack_d4 >= sStack_e4) * sStack_d4;
  uVar25 = (ushort)(sStack_d2 < sStack_e2) * sStack_e2 |
           (ushort)(sStack_d2 >= sStack_e2) * sStack_d2;
  uVar27 = (ushort)(sStack_d0 < sStack_e0) * sStack_e0 |
           (ushort)(sStack_d0 >= sStack_e0) * sStack_d0;
  uVar30 = (ushort)(sStack_ce < sStack_de) * sStack_de |
           (ushort)(sStack_ce >= sStack_de) * sStack_ce;
  uVar32 = (ushort)(sStack_cc < sStack_dc) * sStack_dc |
           (ushort)(sStack_cc >= sStack_dc) * sStack_cc;
  uVar34 = (ushort)(sStack_ca < sStack_da) * sStack_da |
           (ushort)(sStack_ca >= sStack_da) * sStack_ca;
  local_c78._0_4_ =
       CONCAT22(((short)uVar21 < (short)uVar22) * uVar22 | ((short)uVar21 >= (short)uVar22) * uVar21
                ,((short)uVar17 < (short)uVar18) * uVar18 |
                 ((short)uVar17 >= (short)uVar18) * uVar17);
  local_c78._0_6_ =
       CONCAT24(((short)uVar23 < (short)uVar24) * uVar24 | ((short)uVar23 >= (short)uVar24) * uVar23
                ,(undefined4)local_c78);
  local_c78 = CONCAT26(((short)uVar25 < (short)uVar26) * uVar26 |
                       ((short)uVar25 >= (short)uVar26) * uVar25,(undefined6)local_c78);
  uStack_c70._0_2_ =
       ((short)uVar27 < (short)uVar28) * uVar28 | ((short)uVar27 >= (short)uVar28) * uVar27;
  uStack_c70._2_2_ =
       ((short)uVar30 < (short)uVar31) * uVar31 | ((short)uVar30 >= (short)uVar31) * uVar30;
  uStack_c70._4_2_ =
       ((short)uVar32 < (short)uVar33) * uVar33 | ((short)uVar32 >= (short)uVar33) * uVar32;
  uStack_c70._6_2_ =
       ((short)uVar34 < (short)uVar35) * uVar35 | ((short)uVar34 >= (short)uVar35) * uVar34;
  auVar36._8_8_ = 0x1000100010001;
  auVar36._0_8_ = 0x1000100010001;
  auVar20 = psllw(auVar36,ZEXT416(local_bfc - 8));
  auVar10._8_8_ = uStack_c70;
  auVar10._0_8_ = local_c78;
  auVar20 = psubusw(auVar10,auVar20);
  local_a88 = auVar20._0_2_;
  sStack_a86 = auVar20._2_2_;
  sStack_a84 = auVar20._4_2_;
  sStack_a82 = auVar20._6_2_;
  sStack_a80 = auVar20._8_2_;
  sStack_a7e = auVar20._10_2_;
  sStack_a7c = auVar20._12_2_;
  sStack_a7a = auVar20._14_2_;
  local_a98 = (short)local_c18;
  sStack_a96 = (short)((ulong)local_c18 >> 0x10);
  sStack_a94 = (short)((ulong)local_c18 >> 0x20);
  sStack_a92 = (short)((ulong)local_c18 >> 0x30);
  sStack_a90 = (short)uStack_c10;
  sStack_a8e = (short)((ulong)uStack_c10 >> 0x10);
  sStack_a8c = (short)((ulong)uStack_c10 >> 0x20);
  sStack_a8a = (short)((ulong)uStack_c10 >> 0x30);
  local_c78._0_4_ = CONCAT22(-(ushort)(sStack_a86 == sStack_a96),-(ushort)(local_a88 == local_a98));
  local_c78._0_6_ = CONCAT24(-(ushort)(sStack_a84 == sStack_a94),(undefined4)local_c78);
  local_c78 = CONCAT26(-(ushort)(sStack_a82 == sStack_a92),(undefined6)local_c78);
  uStack_c70._0_2_ = -(ushort)(sStack_a80 == sStack_a90);
  uStack_c70._2_2_ = -(ushort)(sStack_a7e == sStack_a8e);
  uStack_c70._4_2_ = -(ushort)(sStack_a7c == sStack_a8c);
  uStack_c70._6_2_ = -(ushort)(sStack_a7a == sStack_a8a);
  local_c78 = local_c78 & local_c68;
  uStack_c70 = uStack_c70 & uStack_c60;
  local_aa8 = (short)local_c78;
  sStack_aa6 = (short)(local_c78 >> 0x10);
  sStack_aa4 = (short)(local_c78 >> 0x20);
  sStack_aa2 = (short)(local_c78 >> 0x30);
  sStack_aa0 = (short)uStack_c70;
  sStack_a9e = (short)(uStack_c70 >> 0x10);
  sStack_a9c = (short)(uStack_c70 >> 0x20);
  sStack_a9a = (short)(uStack_c70 >> 0x30);
  uVar17 = -(ushort)(sStack_a9a == sStack_a8a);
  auVar20._2_2_ = -(ushort)(sStack_aa6 == sStack_a96);
  auVar20._0_2_ = -(ushort)(local_aa8 == local_a98);
  auVar20._4_2_ = -(ushort)(sStack_aa4 == sStack_a94);
  auVar20._6_2_ = -(ushort)(sStack_aa2 == sStack_a92);
  auVar20._8_2_ = -(ushort)(sStack_aa0 == sStack_a90);
  auVar20._10_2_ = -(ushort)(sStack_a9e == sStack_a8e);
  auVar20._12_2_ = -(ushort)(sStack_a9c == sStack_a8c);
  auVar20._14_2_ = uVar17;
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uVar17 >> 7) & 1) << 0xe | uVar17 & 0x8000) == 0xffff) {
    *(ulong *)*local_bb8 = local_d98;
    *(ulong *)(*local_bb8 + 8) = uStack_d90;
    *(ulong *)*local_bc0 = local_d88;
    *(ulong *)(*local_bc0 + 8) = uStack_d80;
    *(ulong *)*local_bb0 = local_d78;
    *(ulong *)(*local_bb0 + 8) = uStack_d70;
    *(ulong *)*local_ba8 = CONCAT44(uStack_d64,local_d68);
    *(ulong *)(*local_ba8 + 8) = CONCAT44(uStack_d5c,uStack_d60);
  }
  else {
    uVar1 = *(undefined8 *)*local_bb0;
    uVar2 = *(undefined8 *)(*local_bb0 + 8);
    local_838 = (short)uVar1;
    sStack_836 = (short)((ulong)uVar1 >> 0x10);
    sStack_834 = (short)((ulong)uVar1 >> 0x20);
    sStack_832 = (short)((ulong)uVar1 >> 0x30);
    sStack_830 = (short)uVar2;
    sStack_82e = (short)((ulong)uVar2 >> 0x10);
    sStack_82c = (short)((ulong)uVar2 >> 0x20);
    sStack_82a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_ba8;
    uVar2 = *(undefined8 *)(*local_ba8 + 8);
    local_858 = (short)uVar1;
    sStack_856 = (short)((ulong)uVar1 >> 0x10);
    sStack_854 = (short)((ulong)uVar1 >> 0x20);
    sStack_852 = (short)((ulong)uVar1 >> 0x30);
    sStack_850 = (short)uVar2;
    sStack_84e = (short)((ulong)uVar2 >> 0x10);
    sStack_84c = (short)((ulong)uVar2 >> 0x20);
    sStack_84a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_ba0;
    uVar2 = *(undefined8 *)(*local_ba0 + 8);
    local_8c8 = (short)uVar1;
    sStack_8c6 = (short)((ulong)uVar1 >> 0x10);
    sStack_8c4 = (short)((ulong)uVar1 >> 0x20);
    sStack_8c2 = (short)((ulong)uVar1 >> 0x30);
    sStack_8c0 = (short)uVar2;
    sStack_8be = (short)((ulong)uVar2 >> 0x10);
    sStack_8bc = (short)((ulong)uVar2 >> 0x20);
    sStack_8ba = (short)((ulong)uVar2 >> 0x30);
    local_8c8 = local_838 * 2 + local_858 * 2 + 4 + local_8c8;
    sStack_8c6 = sStack_836 * 2 + sStack_856 * 2 + 4 + sStack_8c6;
    sStack_8c4 = sStack_834 * 2 + sStack_854 * 2 + 4 + sStack_8c4;
    sStack_8c2 = sStack_832 * 2 + sStack_852 * 2 + 4 + sStack_8c2;
    sStack_8c0 = sStack_830 * 2 + sStack_850 * 2 + 4 + sStack_8c0;
    sStack_8be = sStack_82e * 2 + sStack_84e * 2 + 4 + sStack_8be;
    sStack_8bc = sStack_82c * 2 + sStack_84c * 2 + 4 + sStack_8bc;
    sStack_8ba = sStack_82a * 2 + sStack_84a * 2 + 4 + sStack_8ba;
    uVar1 = *(undefined8 *)*local_ba0;
    uVar2 = *(undefined8 *)(*local_ba0 + 8);
    local_8d8 = (short)uVar1;
    sStack_8d6 = (short)((ulong)uVar1 >> 0x10);
    sStack_8d4 = (short)((ulong)uVar1 >> 0x20);
    sStack_8d2 = (short)((ulong)uVar1 >> 0x30);
    sStack_8d0 = (short)uVar2;
    sStack_8ce = (short)((ulong)uVar2 >> 0x10);
    sStack_8cc = (short)((ulong)uVar2 >> 0x20);
    sStack_8ca = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_bb8;
    uVar2 = *(undefined8 *)(*local_bb8 + 8);
    local_908 = (short)uVar1;
    sStack_906 = (short)((ulong)uVar1 >> 0x10);
    sStack_904 = (short)((ulong)uVar1 >> 0x20);
    sStack_902 = (short)((ulong)uVar1 >> 0x30);
    sStack_900 = (short)uVar2;
    sStack_8fe = (short)((ulong)uVar2 >> 0x10);
    sStack_8fc = (short)((ulong)uVar2 >> 0x20);
    sStack_8fa = (short)((ulong)uVar2 >> 0x30);
    local_cf8 = CONCAT26((ushort)(sStack_8c2 + sStack_8d2 * 2 + sStack_902) >> 3,
                         CONCAT24((ushort)(sStack_8c4 + sStack_8d4 * 2 + sStack_904) >> 3,
                                  CONCAT22((ushort)(sStack_8c6 + sStack_8d6 * 2 + sStack_906) >> 3,
                                           (ushort)(local_8c8 + local_8d8 * 2 + local_908) >> 3)));
    uStack_cf0 = CONCAT26((ushort)(sStack_8ba + sStack_8ca * 2 + sStack_8fa) >> 3,
                          CONCAT24((ushort)(sStack_8bc + sStack_8cc * 2 + sStack_8fc) >> 3,
                                   CONCAT22((ushort)(sStack_8be + sStack_8ce * 2 + sStack_8fe) >> 3,
                                            (ushort)(sStack_8c0 + sStack_8d0 * 2 + sStack_900) >> 3)
                                  ));
    uVar1 = *(undefined8 *)*local_bb8;
    uVar2 = *(undefined8 *)(*local_bb8 + 8);
    local_938 = (short)uVar1;
    sStack_936 = (short)((ulong)uVar1 >> 0x10);
    sStack_934 = (short)((ulong)uVar1 >> 0x20);
    sStack_932 = (short)((ulong)uVar1 >> 0x30);
    sStack_930 = (short)uVar2;
    sStack_92e = (short)((ulong)uVar2 >> 0x10);
    sStack_92c = (short)((ulong)uVar2 >> 0x20);
    sStack_92a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_bc0;
    uVar2 = *(undefined8 *)(*local_bc0 + 8);
    local_968 = (short)uVar1;
    sStack_966 = (short)((ulong)uVar1 >> 0x10);
    sStack_964 = (short)((ulong)uVar1 >> 0x20);
    sStack_962 = (short)((ulong)uVar1 >> 0x30);
    sStack_960 = (short)uVar2;
    sStack_95e = (short)((ulong)uVar2 >> 0x10);
    sStack_95c = (short)((ulong)uVar2 >> 0x20);
    sStack_95a = (short)((ulong)uVar2 >> 0x30);
    uVar17 = local_8c8 + local_938 * 2 + local_968;
    uVar18 = sStack_8c6 + sStack_936 * 2 + sStack_966;
    uVar21 = sStack_8c4 + sStack_934 * 2 + sStack_964;
    uVar22 = sStack_8c2 + sStack_932 * 2 + sStack_962;
    uVar23 = sStack_8c0 + sStack_930 * 2 + sStack_960;
    uVar24 = sStack_8be + sStack_92e * 2 + sStack_95e;
    uVar25 = sStack_8bc + sStack_92c * 2 + sStack_95c;
    uVar26 = sStack_8ba + sStack_92a * 2 + sStack_95a;
    local_d08 = CONCAT26(uVar22 >> 3,CONCAT24(uVar21 >> 3,CONCAT22(uVar18 >> 3,uVar17 >> 3)));
    uStack_d00 = CONCAT26(uVar26 >> 3,CONCAT24(uVar25 >> 3,CONCAT22(uVar24 >> 3,uVar23 >> 3)));
    uVar1 = *(undefined8 *)*local_ba0;
    uVar2 = *(undefined8 *)(*local_ba0 + 8);
    local_7c8 = (short)uVar1;
    sStack_7c6 = (short)((ulong)uVar1 >> 0x10);
    sStack_7c4 = (short)((ulong)uVar1 >> 0x20);
    sStack_7c2 = (short)((ulong)uVar1 >> 0x30);
    sStack_7c0 = (short)uVar2;
    sStack_7be = (short)((ulong)uVar2 >> 0x10);
    sStack_7bc = (short)((ulong)uVar2 >> 0x20);
    sStack_7ba = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_ba8;
    uVar2 = *(undefined8 *)(*local_ba8 + 8);
    local_7e8 = (short)uVar1;
    sStack_7e6 = (short)((ulong)uVar1 >> 0x10);
    sStack_7e4 = (short)((ulong)uVar1 >> 0x20);
    sStack_7e2 = (short)((ulong)uVar1 >> 0x30);
    sStack_7e0 = (short)uVar2;
    sStack_7de = (short)((ulong)uVar2 >> 0x10);
    sStack_7dc = (short)((ulong)uVar2 >> 0x20);
    sStack_7da = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_bc0;
    uVar2 = *(undefined8 *)(*local_bc0 + 8);
    uVar3 = *(undefined8 *)*local_bc8;
    uVar4 = *(undefined8 *)(*local_bc8 + 8);
    local_998 = (short)uVar1;
    sStack_996 = (short)((ulong)uVar1 >> 0x10);
    sStack_994 = (short)((ulong)uVar1 >> 0x20);
    sStack_992 = (short)((ulong)uVar1 >> 0x30);
    sStack_990 = (short)uVar2;
    sStack_98e = (short)((ulong)uVar2 >> 0x10);
    sStack_98c = (short)((ulong)uVar2 >> 0x20);
    sStack_98a = (short)((ulong)uVar2 >> 0x30);
    local_9a8 = (short)uVar3;
    sStack_9a6 = (short)((ulong)uVar3 >> 0x10);
    sStack_9a4 = (short)((ulong)uVar3 >> 0x20);
    sStack_9a2 = (short)((ulong)uVar3 >> 0x30);
    sStack_9a0 = (short)uVar4;
    sStack_99e = (short)((ulong)uVar4 >> 0x10);
    sStack_99c = (short)((ulong)uVar4 >> 0x20);
    sStack_99a = (short)((ulong)uVar4 >> 0x30);
    uVar17 = ((uVar17 - local_7c8) - local_7e8) + local_998 + local_9a8;
    uVar18 = ((uVar18 - sStack_7c6) - sStack_7e6) + sStack_996 + sStack_9a6;
    uVar21 = ((uVar21 - sStack_7c4) - sStack_7e4) + sStack_994 + sStack_9a4;
    uVar22 = ((uVar22 - sStack_7c2) - sStack_7e2) + sStack_992 + sStack_9a2;
    uVar23 = ((uVar23 - sStack_7c0) - sStack_7e0) + sStack_990 + sStack_9a0;
    uVar24 = ((uVar24 - sStack_7be) - sStack_7de) + sStack_98e + sStack_99e;
    uVar25 = ((uVar25 - sStack_7bc) - sStack_7dc) + sStack_98c + sStack_99c;
    uVar26 = ((uVar26 - sStack_7ba) - sStack_7da) + sStack_98a + sStack_99a;
    local_d18 = CONCAT26(uVar22 >> 3,CONCAT24(uVar21 >> 3,CONCAT22(uVar18 >> 3,uVar17 >> 3)));
    uStack_d10 = CONCAT26(uVar26 >> 3,CONCAT24(uVar25 >> 3,CONCAT22(uVar24 >> 3,uVar23 >> 3)));
    uVar1 = *(undefined8 *)*local_ba8;
    uVar2 = *(undefined8 *)(*local_ba8 + 8);
    local_808 = (short)uVar1;
    sStack_806 = (short)((ulong)uVar1 >> 0x10);
    sStack_804 = (short)((ulong)uVar1 >> 0x20);
    sStack_802 = (short)((ulong)uVar1 >> 0x30);
    sStack_800 = (short)uVar2;
    sStack_7fe = (short)((ulong)uVar2 >> 0x10);
    sStack_7fc = (short)((ulong)uVar2 >> 0x20);
    sStack_7fa = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_bb0;
    uVar2 = *(undefined8 *)(*local_bb0 + 8);
    local_828 = (short)uVar1;
    sStack_826 = (short)((ulong)uVar1 >> 0x10);
    sStack_824 = (short)((ulong)uVar1 >> 0x20);
    sStack_822 = (short)((ulong)uVar1 >> 0x30);
    sStack_820 = (short)uVar2;
    sStack_81e = (short)((ulong)uVar2 >> 0x10);
    sStack_81c = (short)((ulong)uVar2 >> 0x20);
    sStack_81a = (short)((ulong)uVar2 >> 0x30);
    uVar1 = *(undefined8 *)*local_bc8;
    uVar2 = *(undefined8 *)(*local_bc8 + 8);
    local_9d8 = (short)uVar1;
    sStack_9d6 = (short)((ulong)uVar1 >> 0x10);
    sStack_9d4 = (short)((ulong)uVar1 >> 0x20);
    sStack_9d2 = (short)((ulong)uVar1 >> 0x30);
    sStack_9d0 = (short)uVar2;
    sStack_9ce = (short)((ulong)uVar2 >> 0x10);
    sStack_9cc = (short)((ulong)uVar2 >> 0x20);
    sStack_9ca = (short)((ulong)uVar2 >> 0x30);
    local_d28 = CONCAT26((ushort)(((uVar22 - sStack_802) - sStack_822) + sStack_9d2 * 2) >> 3,
                         CONCAT24((ushort)(((uVar21 - sStack_804) - sStack_824) + sStack_9d4 * 2) >>
                                  3,CONCAT22((ushort)(((uVar18 - sStack_806) - sStack_826) +
                                                     sStack_9d6 * 2) >> 3,
                                             (ushort)(((uVar17 - local_808) - local_828) +
                                                     local_9d8 * 2) >> 3)));
    uStack_d20 = CONCAT26((ushort)(((uVar26 - sStack_7fa) - sStack_81a) + sStack_9ca * 2) >> 3,
                          CONCAT24((ushort)(((uVar25 - sStack_7fc) - sStack_81c) + sStack_9cc * 2)
                                   >> 3,CONCAT22((ushort)(((uVar24 - sStack_7fe) - sStack_81e) +
                                                         sStack_9ce * 2) >> 3,
                                                 (ushort)(((uVar23 - sStack_800) - sStack_820) +
                                                         sStack_9d0 * 2) >> 3)));
    *(ulong *)*local_bb8 = ~local_c78 & local_d98 | local_c78 & local_d18;
    *(ulong *)(*local_bb8 + 8) = ~uStack_c70 & uStack_d90 | uStack_c70 & uStack_d10;
    *(ulong *)*local_bc0 = ~local_c78 & local_d88 | local_c78 & local_d28;
    *(ulong *)(*local_bc0 + 8) = ~uStack_c70 & uStack_d80 | uStack_c70 & uStack_d20;
    *(ulong *)*local_bb0 = ~local_c78 & local_d78 | local_c78 & local_d08;
    *(ulong *)(*local_bb0 + 8) = ~uStack_c70 & uStack_d70 | uStack_c70 & uStack_d00;
    local_6f8 = (uint)local_c78;
    uStack_6f4 = (uint)(local_c78 >> 0x20);
    uStack_6f0 = (uint)uStack_c70;
    uStack_6ec = (uint)(uStack_c70 >> 0x20);
    *(ulong *)*local_ba8 =
         CONCAT44((uStack_6f4 ^ 0xffffffff) & uStack_d64,(local_6f8 ^ 0xffffffff) & local_d68) |
         local_c78 & local_cf8;
    *(ulong *)(*local_ba8 + 8) =
         CONCAT44((uStack_6ec ^ 0xffffffff) & uStack_d5c,(uStack_6f0 ^ 0xffffffff) & uStack_d60) |
         uStack_c70 & uStack_cf0;
  }
  puVar16 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1) * -2);
  *puVar16 = local_f18._0_8_;
  puVar16[1] = local_f18._8_8_;
  puVar16 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  *puVar16 = local_f28._0_8_;
  puVar16[1] = local_f28._8_8_;
  (*in_RDI)[0] = local_f38;
  (*in_RDI)[1] = lStack_f30;
  puVar16 = (undefined8 *)((long)*in_RDI + (long)in_ESI * 2);
  *puVar16 = local_f48._0_8_;
  puVar16[1] = local_f48._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p2, p1, p0, q0, q1, q2;

  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s + 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
  _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
  _mm_storeu_si128((__m128i *)(s + 0 * p), q0);
  _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
}